

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O1

ares_slist_node_t * ares_slist_insert(ares_slist_t *list,void *val)

{
  ares_slist_node_t *node;
  ares_slist_node_t **ppaVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if ((val != (void *)0x0 && list != (ares_slist_t *)0x0) &&
     (node = (ares_slist_node_t *)ares_malloc_zero(0x28), node != (ares_slist_node_t *)0x0)) {
    node->data = val;
    node->parent = list;
    sVar4 = list->cnt + 1;
    uVar5 = 4;
    if (0x10 < sVar4) {
      sVar4 = ares_round_up_pow2(sVar4);
      uVar5 = ares_log2(sVar4);
    }
    if (uVar5 < list->levels) {
      uVar5 = list->levels;
    }
    sVar4 = 0;
    uVar3 = 0;
    do {
      if (list->rand_bits == 0) {
        ares_rand_bytes(list->rand_state,list->rand_data,8);
        list->rand_bits = 0x40;
      }
      uVar3 = uVar3 + 1;
      uVar2 = 0x40 - list->rand_bits;
      list->rand_bits = list->rand_bits - 1;
      sVar4 = sVar4 + 8;
    } while (((list->rand_data[uVar2 >> 3] >> ((uint)uVar2 & 7) & 1) != 0) && (uVar3 < uVar5));
    node->levels = uVar3;
    ppaVar1 = (ares_slist_node_t **)ares_malloc_zero(sVar4);
    node->next = ppaVar1;
    if (ppaVar1 != (ares_slist_node_t **)0x0) {
      ppaVar1 = (ares_slist_node_t **)ares_malloc_zero(node->levels << 3);
      node->prev = ppaVar1;
      if (ppaVar1 != (ares_slist_node_t **)0x0) {
        if (node->levels <= list->levels) {
LAB_0011c74e:
          ares_slist_node_push(list,node);
          list->cnt = list->cnt + 1;
          return node;
        }
        ppaVar1 = (ares_slist_node_t **)
                  ares_realloc_zero(list->head,list->levels << 3,node->levels << 3);
        if (ppaVar1 != (ares_slist_node_t **)0x0) {
          list->head = ppaVar1;
          list->levels = node->levels;
          goto LAB_0011c74e;
        }
      }
    }
    ares_free(node->prev);
    ares_free(node->next);
    ares_free(node);
  }
  return (ares_slist_node_t *)0x0;
}

Assistant:

ares_slist_node_t *ares_slist_insert(ares_slist_t *list, void *val)
{
  ares_slist_node_t *node = NULL;

  if (list == NULL || val == NULL) {
    return NULL;
  }

  node = ares_malloc_zero(sizeof(*node));

  if (node == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->data   = val;
  node->parent = list;

  /* Randomly determine the number of levels we want to use */
  node->levels = ares_slist_calc_level(list);

  /* Allocate array of next and prev nodes for linking each level */
  node->next = ares_malloc_zero(sizeof(*node->next) * node->levels);
  if (node->next == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->prev = ares_malloc_zero(sizeof(*node->prev) * node->levels);
  if (node->prev == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* If the number of levels is greater than we currently support in the slist,
   * increase the count */
  if (list->levels < node->levels) {
    void *ptr =
      ares_realloc_zero(list->head, sizeof(*list->head) * list->levels,
                        sizeof(*list->head) * node->levels);
    if (ptr == NULL) {
      goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
    }

    list->head   = ptr;
    list->levels = node->levels;
  }

  ares_slist_node_push(list, node);

  list->cnt++;

  return node;

/* LCOV_EXCL_START: OutOfMemory */
fail:
  if (node) {
    ares_free(node->prev);
    ares_free(node->next);
    ares_free(node);
  }
  return NULL;
  /* LCOV_EXCL_STOP */
}